

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O1

PyObject * pybind11::detail::make_new_instance(PyTypeObject *type,bool allocate_value)

{
  PyTypeObject *t;
  instance *this;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var1;
  void *valueptr;
  internals *piVar2;
  undefined7 in_register_00000031;
  PyTypeObject *unaff_R12;
  long *plVar3;
  long lVar4;
  void **vptr;
  anon_union_24_2_63b86169_for_instance_1 *paVar5;
  type_info *tinfo;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar6;
  instance *local_40;
  void *local_38;
  
  this = (instance *)(*type->tp_alloc)(type,0);
  instance::allocate_layout(this);
  this->field_0x30 = this->field_0x30 | 1;
  if ((int)CONCAT71(in_register_00000031,allocate_value) != 0) {
    t = (this->ob_base).ob_type;
    pVar6 = all_type_info_get_cache(unaff_R12);
    _Var1 = pVar6.first.
            super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
            ._M_cur;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      all_type_info_populate
                (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                    *)((long)_Var1.
                             super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                             ._M_cur + 0x10));
    }
    plVar3 = *(long **)((long)_Var1.
                              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                              ._M_cur + 0x10);
    lVar4 = (long)*(long **)((long)_Var1.
                                   super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                   ._M_cur + 0x18) - (long)plVar3;
    if (lVar4 == 0) {
      tinfo = (type_info *)0x0;
    }
    else {
      tinfo = (type_info *)*plVar3;
    }
    paVar5 = &this->field_1;
    if ((this->field_0x30 & 2) == 0) {
      paVar5 = (anon_union_24_2_63b86169_for_instance_1 *)(paVar5->nonsimple).values_and_holders;
    }
    if (*(long **)((long)_Var1.
                         super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                         ._M_cur + 0x18) != plVar3) {
      lVar4 = lVar4 >> 3;
      do {
        valueptr = (*tinfo->operator_new)(tinfo->type_size);
        paVar5->simple_value_holder[0] = valueptr;
        local_40 = this;
        local_38 = valueptr;
        piVar2 = get_internals();
        std::
        _Hashtable<void_const*,std::pair<void_const*const,pybind11::detail::instance*>,std::allocator<std::pair<void_const*const,pybind11::detail::instance*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
        ::_M_emplace<void*&,pybind11::detail::instance*&>
                  ((_Hashtable<void_const*,std::pair<void_const*const,pybind11::detail::instance*>,std::allocator<std::pair<void_const*const,pybind11::detail::instance*>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                    *)&piVar2->registered_instances,0,&local_38,&local_40);
        if ((tinfo->field_0x80 & 2) == 0) {
          traverse_offset_bases(valueptr,tinfo,this,register_instance_impl);
        }
        if ((this->field_0x30 & 2) == 0) {
          tinfo = (type_info *)plVar3[1];
          paVar5 = (anon_union_24_2_63b86169_for_instance_1 *)
                   ((long)paVar5 + *(long *)(*plVar3 + 0x18) * 8 + 8);
          plVar3 = plVar3 + 1;
        }
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  return &this->ob_base;
}

Assistant:

inline PyObject *make_new_instance(PyTypeObject *type, bool allocate_value /*= true (in cast.h)*/) {
#if defined(PYPY_VERSION)
    // PyPy gets tp_basicsize wrong (issue 2482) under multiple inheritance when the first inherited
    // object is a a plain Python type (i.e. not derived from an extension type).  Fix it.
    ssize_t instance_size = static_cast<ssize_t>(sizeof(instance));
    if (type->tp_basicsize < instance_size) {
        type->tp_basicsize = instance_size;
    }
#endif
    PyObject *self = type->tp_alloc(type, 0);
    auto inst = reinterpret_cast<instance *>(self);
    // Allocate the value/holder internals:
    inst->allocate_layout();

    inst->owned = true;
    // Allocate (if requested) the value pointers; otherwise leave them as nullptr
    if (allocate_value) {
        for (auto &v_h : values_and_holders(inst)) {
            void *&vptr = v_h.value_ptr();
            vptr = v_h.type->operator_new(v_h.type->type_size);
            register_instance(inst, vptr, v_h.type);
        }
    }

    return self;
}